

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::cmNinjaTargetGenerator
          (cmNinjaTargetGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  MacOSXContentGeneratorType *pMVar2;
  _Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false> _Var3;
  cmLocalNinjaGenerator *pcVar4;
  mapped_type *pmVar5;
  pointer *__ptr;
  key_type *__k;
  _Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false> local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  cmCommonTargetGenerator::cmCommonTargetGenerator(&this->super_cmCommonTargetGenerator,target);
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaTargetGenerator_007d31d0;
  (this->OSXBundleGenerator)._M_t.
  super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
  super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl = (cmOSXBundleGenerator *)0x0;
  p_Var1 = &(this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar4 = (cmLocalNinjaGenerator *)cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar4;
  (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->Configs)._M_t._M_impl.super__Rb_tree_header;
  (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_50 + 8),target->Makefile,IncludeEmptyConfig);
  for (__k = (key_type *)local_50._8_8_; __k != (key_type *)local_40._M_allocated_capacity;
      __k = __k + 1) {
    local_50._0_8_ = this;
    std::
    make_unique<cmNinjaTargetGenerator::MacOSXContentGeneratorType,cmNinjaTargetGenerator*,std::__cxx11::string_const&>
              ((cmNinjaTargetGenerator **)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
             ::operator[](&this->Configs,__k);
    _Var3._M_head_impl = local_58._M_head_impl;
    local_58._M_head_impl = (MacOSXContentGeneratorType *)0x0;
    pMVar2 = (pmVar5->MacOSXContentGenerator)._M_t.
             super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
             .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
             _M_head_impl;
    (pmVar5->MacOSXContentGenerator)._M_t.
    super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
    .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>._M_head_impl
         = _Var3._M_head_impl;
    if (pMVar2 != (MacOSXContentGeneratorType *)0x0) {
      (*(pMVar2->super_MacOSXContentGeneratorType)._vptr_MacOSXContentGeneratorType[1])();
      if (local_58._M_head_impl != (MacOSXContentGeneratorType *)0x0) {
        (*((local_58._M_head_impl)->super_MacOSXContentGeneratorType).
          _vptr_MacOSXContentGeneratorType[1])();
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_50 + 8));
  return;
}

Assistant:

cmNinjaTargetGenerator::cmNinjaTargetGenerator(cmGeneratorTarget* target)
  : cmCommonTargetGenerator(target)
  , OSXBundleGenerator(nullptr)
  , LocalGenerator(
      static_cast<cmLocalNinjaGenerator*>(target->GetLocalGenerator()))
{
  for (auto const& fileConfig :
       target->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig)) {
    this->Configs[fileConfig].MacOSXContentGenerator =
      cm::make_unique<MacOSXContentGeneratorType>(this, fileConfig);
  }
}